

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_SpecifiedFieldsEqualityAllTest_Test::
TestBody(MessageDifferencerTest_SpecifiedFieldsEqualityAllTest_Test *this)

{
  bool bVar1;
  Reflection *pRVar2;
  char *message;
  char *in_R9;
  string local_8c8;
  AssertHelper local_8a8;
  Message local_8a0;
  bool local_891;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields1;
  undefined1 local_690 [8];
  TestAllTypes msg2;
  TestAllTypes msg1;
  MessageDifferencerTest_SpecifiedFieldsEqualityAllTest_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&fields2.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&differencer.unpack_any_field_);
  pRVar2 = proto2_unittest::TestAllTypes::GetReflection();
  Reflection::ListFields
            (pRVar2,(Message *)((long)&msg2.field_0 + 0x328),
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&fields2.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pRVar2 = proto2_unittest::TestAllTypes::GetReflection();
  Reflection::ListFields
            (pRVar2,(Message *)local_690,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  local_891 = util::MessageDifferencer::CompareWithFields
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)&fields2.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)&differencer.unpack_any_field_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_890,&local_891,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8c8,(internal *)local_890,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields1, fields2)",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x4ea,message);
    testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&differencer.unpack_any_field_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&fields2.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  return;
}

Assistant:

TEST(MessageDifferencerTest, SpecifiedFieldsEqualityAllTest) {
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  std::vector<const FieldDescriptor*> fields1;
  std::vector<const FieldDescriptor*> fields2;
  msg1.GetReflection()->ListFields(msg1, &fields1);
  msg2.GetReflection()->ListFields(msg2, &fields2);

  util::MessageDifferencer differencer;
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields1, fields2));
}